

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Quaternion<double,_0>,_std::allocator<Eigen::Quaternion<double,_0>_>_>
                   *q,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  R;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_60;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_48;
  
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = *(long *)(q + 8) - *(long *)q >> 5;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::resize((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)&local_a8,uVar2 & 0xffffffff);
  lVar3 = 0;
  for (lVar1 = 0; (uVar2 & 0xffffffff) * 0x48 - lVar1 != 0; lVar1 = lVar1 + 0x48) {
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,3,3,0,3,3> *)
               ((long)((local_a8._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                      .array + lVar1),
               (RotationBase<Eigen::Quaternion<double,_0>,_3> *)(*(long *)q + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)&local_48,
           (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)&local_a8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&local_60,P);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,theta_d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_90,theta_dd);
  getTau(__return_storage_ptr__,this,G,
         (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          *)&local_48,
         (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)&local_60,(vector<double,_std::allocator<double>_> *)&local_78,
         (vector<double,_std::allocator<double>_> *)&local_90);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_60);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_48);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Quaterniond> q, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    vector<Eigen::Matrix3d> R;
    unsigned int len = q.size();
    R.resize(len);
    for (int i = 0; i < len; i++)
    {
        R[i] = q[i];
    }
    return getTau(G, R, P, theta_d, theta_dd);
}